

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBegin_usingCDict_advanced
                 (ZSTD_CCtx *cctx,ZSTD_CDict *cdict,ZSTD_frameParameters fParams,
                 unsigned_long_long pledgedSrcSize)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  U32 UVar4;
  uint uVar5;
  size_t sVar6;
  int compressionLevel;
  unsigned_long_long uVar7;
  ZSTD_compressionParameters local_e8;
  ZSTD_CCtx_params local_c0;
  
  if (cdict == (ZSTD_CDict *)0x0) {
    return 0xffffffffffffffe0;
  }
  memcpy(&local_c0,&cctx->requestedParams,0x90);
  if (((pledgedSrcSize < 0x20000) || (pledgedSrcSize == 0xffffffffffffffff)) ||
     (sVar6 = cdict->dictContentSize, pledgedSrcSize <= sVar6 * 6 && sVar6 * 6 - pledgedSrcSize != 0
     )) {
    if (local_c0.attachDictPref != ZSTD_dictForceLoad) {
LAB_0013d803:
      local_e8.windowLog = (cdict->matchState).cParams.windowLog;
      local_e8.chainLog = (cdict->matchState).cParams.chainLog;
      uVar1 = (cdict->matchState).cParams.hashLog;
      uVar2 = (cdict->matchState).cParams.searchLog;
      uVar3 = (cdict->matchState).cParams.minMatch;
      local_e8.targetLength = (cdict->matchState).cParams.targetLength;
      local_e8.strategy = (cdict->matchState).cParams.strategy;
      local_e8.hashLog = uVar1;
      local_e8.searchLog = uVar2;
      local_e8.minMatch = uVar3;
      goto LAB_0013d81f;
    }
    compressionLevel = cdict->compressionLevel;
    sVar6 = cdict->dictContentSize;
  }
  else {
    compressionLevel = cdict->compressionLevel;
    if ((compressionLevel == 0) && (local_c0.attachDictPref != ZSTD_dictForceLoad))
    goto LAB_0013d803;
  }
  ZSTD_getCParams(&local_e8,compressionLevel,pledgedSrcSize,sVar6);
LAB_0013d81f:
  local_c0.cParams.minMatch = local_e8.minMatch;
  local_c0.cParams.targetLength = local_e8.targetLength;
  local_c0.cParams.strategy = local_e8.strategy;
  local_c0.cParams.windowLog = local_e8.windowLog;
  local_c0.cParams.chainLog = local_e8.chainLog;
  local_c0.cParams.hashLog = local_e8.hashLog;
  local_c0.cParams.searchLog = local_e8.searchLog;
  if (pledgedSrcSize != 0xffffffffffffffff) {
    if (pledgedSrcSize < 2) {
      uVar5 = 1;
    }
    else {
      uVar7 = 0x80000;
      if (pledgedSrcSize < 0x80000) {
        uVar7 = pledgedSrcSize;
      }
      UVar4 = ZSTD_highbit32((int)uVar7 - 1);
      uVar5 = UVar4 + 1;
    }
    if (uVar5 < local_c0.cParams.windowLog) {
      uVar5 = local_c0.cParams.windowLog;
    }
    local_c0.cParams.windowLog = uVar5;
  }
  local_c0.fParams._0_8_ = fParams._0_8_;
  local_c0.fParams.noDictIDFlag = fParams.noDictIDFlag;
  sVar6 = ZSTD_compressBegin_internal
                    (cctx,(void *)0x0,0,ZSTD_dct_auto,ZSTD_dtlm_fast,cdict,&local_c0,pledgedSrcSize,
                     ZSTDb_not_buffered);
  return sVar6;
}

Assistant:

size_t ZSTD_compressBegin_usingCDict_advanced(
    ZSTD_CCtx* const cctx, const ZSTD_CDict* const cdict,
    ZSTD_frameParameters const fParams, unsigned long long const pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_compressBegin_usingCDict_advanced");
    RETURN_ERROR_IF(cdict==NULL, dictionary_wrong);
    {   ZSTD_CCtx_params params = cctx->requestedParams;
        params.cParams = ( pledgedSrcSize < ZSTD_USE_CDICT_PARAMS_SRCSIZE_CUTOFF
                        || pledgedSrcSize < cdict->dictContentSize * ZSTD_USE_CDICT_PARAMS_DICTSIZE_MULTIPLIER
                        || pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN
                        || cdict->compressionLevel == 0 )
                      && (params.attachDictPref != ZSTD_dictForceLoad) ?
                ZSTD_getCParamsFromCDict(cdict)
              : ZSTD_getCParams(cdict->compressionLevel,
                                pledgedSrcSize,
                                cdict->dictContentSize);
        /* Increase window log to fit the entire dictionary and source if the
         * source size is known. Limit the increase to 19, which is the
         * window log for compression level 1 with the largest source size.
         */
        if (pledgedSrcSize != ZSTD_CONTENTSIZE_UNKNOWN) {
            U32 const limitedSrcSize = (U32)MIN(pledgedSrcSize, 1U << 19);
            U32 const limitedSrcLog = limitedSrcSize > 1 ? ZSTD_highbit32(limitedSrcSize - 1) + 1 : 1;
            params.cParams.windowLog = MAX(params.cParams.windowLog, limitedSrcLog);
        }
        params.fParams = fParams;
        return ZSTD_compressBegin_internal(cctx,
                                           NULL, 0, ZSTD_dct_auto, ZSTD_dtlm_fast,
                                           cdict,
                                           &params, pledgedSrcSize,
                                           ZSTDb_not_buffered);
    }
}